

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor
          (FeatureDescriptor *this,string *name,string *itemFormat)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->Supported = true;
  (this->Prefix)._M_dataplus._M_p = (pointer)&(this->Prefix).field_2;
  (this->Prefix)._M_string_length = 0;
  (this->Prefix).field_2._M_local_buf[0] = '\0';
  (this->Suffix)._M_dataplus._M_p = (pointer)&(this->Suffix).field_2;
  (this->Suffix)._M_string_length = 0;
  (this->Suffix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->ItemPathFormat,(string *)itemFormat);
  std::__cxx11::string::string((string *)&this->ItemNameFormat,(string *)&this->ItemPathFormat);
  return;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor(
  std::string name, std::string itemFormat)
  : Name(std::move(name))
  , Supported(true)
  , ItemPathFormat(std::move(itemFormat))
  , ItemNameFormat(this->ItemPathFormat)
{
}